

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O0

NpyArray * load_the_npz_array(FILE *fp,uint32_t compr_bytes,uint32_t uncompr_bytes)

{
  reference pvVar1;
  runtime_error *this;
  ulong uVar2;
  size_t sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint in_ECX;
  uint in_EDX;
  FILE *in_RSI;
  NpyArray *in_RDI;
  bool *in_stack_00000050;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000058;
  char *in_stack_00000060;
  size_t *in_stack_00000068;
  uchar *in_stack_00000070;
  size_t offset;
  bool fortran_order;
  char type_code;
  size_t word_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  z_stream d_stream;
  int err;
  size_t nread;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_uncompr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_compr;
  NpyArray *array;
  allocator_type *in_stack_fffffffffffffe70;
  size_type in_stack_fffffffffffffe78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe80;
  undefined2 uVar4;
  undefined1 *_word_size;
  NpyArray *this_01;
  reference local_e8;
  uint local_e0;
  reference local_d0;
  uint local_c8;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_74;
  size_t local_70;
  undefined1 local_61;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_60 [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  uint local_18;
  uint local_14;
  FILE *local_10;
  
  this_01 = in_RDI;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x163fc6);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x163ff2);
  uVar4 = 0;
  _word_size = &local_61;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x164010);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x164036);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_30,0);
  local_70 = fread(pvVar1,1,(ulong)local_14,local_10);
  if (local_70 == local_14) {
    local_a8 = 0;
    local_a0 = 0;
    local_98 = 0;
    local_e0 = 0;
    local_e8 = (reference)0x0;
    local_74 = inflateInit2_(&local_e8,0xfffffff1,"1.2.11",0x70);
    local_e0 = local_14;
    local_e8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_30,0);
    local_c8 = local_18;
    local_d0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
    local_74 = inflate(&local_e8,4);
    local_74 = inflateEnd(&local_e8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x16426a);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
    cnpy::parse_npy_header
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058,
               in_stack_00000050);
    cnpy::NpyArray::NpyArray
              (this_01,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
               (size_t)_word_size,(char)((ushort)uVar4 >> 8),SUB21(uVar4,0));
    uVar2 = (ulong)local_18;
    sVar3 = cnpy::NpyArray::num_bytes((NpyArray *)0x1642f1);
    this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
              cnpy::NpyArray::data<unsigned_char>((NpyArray *)0x164317);
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_60,0);
    pvVar1 = pvVar1 + (uVar2 - sVar3);
    sVar3 = cnpy::NpyArray::num_bytes((NpyArray *)0x164349);
    memcpy(this_00,pvVar1,sVar3);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
    return this_01;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"load_the_npy_file: failed fread");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

cnpy::NpyArray load_the_npz_array(FILE* fp, uint32_t compr_bytes, uint32_t uncompr_bytes) {

    std::vector<unsigned char> buffer_compr(compr_bytes);
    std::vector<unsigned char> buffer_uncompr(uncompr_bytes);
    size_t nread = fread(&buffer_compr[0],1,compr_bytes,fp);
    if(nread != compr_bytes)
        throw std::runtime_error("load_the_npy_file: failed fread");

    int err;
    z_stream d_stream;

    d_stream.zalloc = Z_NULL;
    d_stream.zfree = Z_NULL;
    d_stream.opaque = Z_NULL;
    d_stream.avail_in = 0;
    d_stream.next_in = Z_NULL;
    err = inflateInit2(&d_stream, -MAX_WBITS);

    d_stream.avail_in = compr_bytes;
    d_stream.next_in = &buffer_compr[0];
    d_stream.avail_out = uncompr_bytes;
    d_stream.next_out = &buffer_uncompr[0];

    err = inflate(&d_stream, Z_FINISH);
    err = inflateEnd(&d_stream);

    std::vector<size_t> shape;
    size_t word_size;
    char type_code;
    bool fortran_order;
    cnpy::parse_npy_header(&buffer_uncompr[0],word_size,type_code,shape,fortran_order);

    cnpy::NpyArray array(shape, word_size, type_code, fortran_order);

    size_t offset = uncompr_bytes - array.num_bytes();
    memcpy(array.data<unsigned char>(),&buffer_uncompr[0]+offset,array.num_bytes());

    return array;
}